

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>,_bool>
* __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
::insert_unique<S2ClosestEdgeQueryBase<S2MinDistance>::Result_const&>
          (pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>,_bool>
           *__return_storage_ptr__,
          btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
          *this,key_type *key,Result *args)

{
  bool bVar1;
  node_type *pnVar2;
  key_type *y;
  undefined8 extraout_RDX;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
  bVar3;
  iterator iVar4;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
  iter;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
  iter_00;
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>,_int>
  res;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
  local_38;
  
  if (*(long *)(this + 0x10) == 0) {
    pnVar2 = btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
             ::new_leaf_root_node
                       ((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                         *)this,1);
    *(node_type **)(this + 8) = pnVar2;
    *(node_type **)this = pnVar2;
  }
  else {
    pnVar2 = *(node_type **)this;
  }
  bVar3._8_8_ = 0;
  bVar3.node = pnVar2;
  internal_locate_plain_compare<S2ClosestEdgeQueryBase<S2MinDistance>::Result,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>,S2ClosestEdgeQueryBase<S2MinDistance>::Result&,S2ClosestEdgeQueryBase<S2MinDistance>::Result*>>
            (&res,this,key,bVar3);
  if (res.second == 0) {
    iter_00.node = (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                    *)(ulong)(uint)res.first.position;
    iter_00._8_8_ = extraout_RDX;
    bVar3 = internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>,S2ClosestEdgeQueryBase<S2MinDistance>::Result&,S2ClosestEdgeQueryBase<S2MinDistance>::Result*>>
                      ((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                        *)res.first.node,iter_00);
    local_38.node = bVar3.node;
    local_38.position = bVar3.position;
    if (local_38.node !=
        (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
         *)0x0) {
      y = btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
          ::key(&local_38);
      bVar1 = operator<(key,y);
      if (!bVar1) {
        (__return_storage_ptr__->first).node = local_38.node;
        *(ulong *)&(__return_storage_ptr__->first).position =
             CONCAT44(local_38._12_4_,local_38.position);
        goto LAB_001fa510;
      }
    }
  }
  else if (res.second == 0x40000000) {
    iter.node = (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                 *)(ulong)(uint)res.first.position;
    iter._8_8_ = extraout_RDX;
    bVar3 = internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>,S2ClosestEdgeQueryBase<S2MinDistance>::Result&,S2ClosestEdgeQueryBase<S2MinDistance>::Result*>>
                      ((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                        *)res.first.node,iter);
    (__return_storage_ptr__->first).node = bVar3.node;
    (__return_storage_ptr__->first).position = bVar3.position;
LAB_001fa510:
    __return_storage_ptr__->second = false;
    return __return_storage_ptr__;
  }
  iVar4.position = res.first.position;
  iVar4.node = res.first.node;
  iVar4._12_4_ = 0;
  iVar4 = internal_emplace<S2ClosestEdgeQueryBase<S2MinDistance>::Result_const&>(this,iVar4,args);
  (__return_storage_ptr__->first).node = iVar4.node;
  (__return_storage_ptr__->first).position = iVar4.position;
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::insert_unique(const key_type &key, Args &&... args)
    -> std::pair<iterator, bool> {
  if (empty()) {
    mutable_root() = rightmost_ = new_leaf_root_node(1);
  }

  std::pair<iterator, int> res = internal_locate(key, iterator(root(), 0));
  iterator &iter = res.first;
  if (res.second == kExactMatch) {
    // The key already exists in the tree, do nothing.
    return std::make_pair(internal_last(iter), false);
  } else if (!res.second) {
    iterator last = internal_last(iter);
    if (last.node && !compare_keys(key, last.key())) {
      // The key already exists in the tree, do nothing.
      return std::make_pair(last, false);
    }
  }

  return std::make_pair(internal_emplace(iter, std::forward<Args>(args)...),
                        true);
}